

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rkd_tree_hh_data.hpp
# Opt level: O2

void pico_tree::internal::
     rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>::
     rotate_point<float_const*,float*>(rotation_type *rotation,float **x,float **y)

{
  float *pfVar1;
  float *pfVar2;
  size_t i;
  long lVar3;
  float fVar4;
  
  pfVar1 = *x;
  fVar4 = 0.0;
  for (lVar3 = 0; lVar3 != 0x310; lVar3 = lVar3 + 1) {
    fVar4 = fVar4 + (rotation->elems_)._M_elems[lVar3] * pfVar1[lVar3];
  }
  pfVar2 = *y;
  for (lVar3 = 0; lVar3 != 0x310; lVar3 = lVar3 + 1) {
    pfVar2[lVar3] = (rotation->elems_)._M_elems[lVar3] * fVar4 * -2.0 + pfVar1[lVar3];
  }
  return;
}

Assistant:

static void rotate_point(
      rotation_type const& rotation, ArrayTypeIn_ const& x, ArrayTypeOut_& y) {
    scalar_type dot = scalar_type(0);
    for (size_t i = 0; i < rotation.size(); ++i) {
      dot += rotation[i] * x[i];
    }
    dot *= scalar_type(2);
    for (size_t i = 0; i < rotation.size(); ++i) {
      y[i] = x[i] - (dot * rotation[i]);
    }
  }